

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O2

int test_xpointer(void)

{
  int iVar1;
  int iVar2;
  xmlChar *pxVar3;
  undefined8 uVar4;
  int test_ret;
  uint uVar5;
  undefined8 in_RSI;
  bool bVar6;
  int n_str;
  int no;
  
  if (quiet == '\0') {
    puts("Testing xpointer : 13 of 21 functions ...");
  }
  no = 0;
  uVar5 = 0;
  do {
    if (no == 5) {
      function_tests = function_tests + 1;
      if (uVar5 != 0) {
        printf("Module xpointer: %d errors\n",(ulong)uVar5);
      }
      return uVar5;
    }
    bVar6 = true;
    while (iVar2 = (int)in_RSI, bVar6) {
      iVar1 = xmlMemBlocks();
      pxVar3 = gen_const_xmlChar_ptr(no,iVar2);
      in_RSI = 0;
      uVar4 = xmlXPtrEval(pxVar3);
      xmlXPathFreeObject(uVar4);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar1 == iVar2) break;
      iVar2 = xmlMemBlocks();
      bVar6 = false;
      printf("Leak of %d blocks found in xmlXPtrEval",(ulong)(uint)(iVar2 - iVar1));
      uVar5 = uVar5 + 1;
      printf(" %d");
      in_RSI = 0;
      printf(" %d");
      putchar(10);
    }
    no = no + 1;
  } while( true );
}

Assistant:

static int
test_xpointer(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing xpointer : 13 of 21 functions ...\n");
    test_ret += test_xmlXPtrBuildNodeList();
    test_ret += test_xmlXPtrEval();
    test_ret += test_xmlXPtrEvalRangePredicate();
    test_ret += test_xmlXPtrNewCollapsedRange();
    test_ret += test_xmlXPtrNewContext();
    test_ret += test_xmlXPtrNewLocationSetNodeSet();
    test_ret += test_xmlXPtrNewLocationSetNodes();
    test_ret += test_xmlXPtrNewRange();
    test_ret += test_xmlXPtrNewRangeNodeObject();
    test_ret += test_xmlXPtrNewRangeNodePoint();
    test_ret += test_xmlXPtrNewRangeNodes();
    test_ret += test_xmlXPtrNewRangePointNode();
    test_ret += test_xmlXPtrNewRangePoints();
    test_ret += test_xmlXPtrRangeToFunction();

    if (test_ret != 0)
	printf("Module xpointer: %d errors\n", test_ret);
    return(test_ret);
}